

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ostream *poVar8;
  size_t sVar9;
  char **ppcVar10;
  string *this;
  long lVar11;
  char *pcVar12;
  char *__s;
  bool bVar13;
  int input_block_length;
  int output_block_length;
  int input_end_number;
  int input_start_number;
  int output_start_number;
  double pad_value;
  ifstream ifs;
  ostringstream error_message_14;
  BlockCopyWrapper block_copy;
  string data_type;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c;
  string local_408;
  ulong local_3e8;
  double local_3e0;
  string local_3d8;
  byte abStack_3b8 [80];
  ios_base local_368 [408];
  string local_1d0 [3];
  ios_base local_160 [264];
  BlockCopyWrapper local_58;
  string local_50;
  
  bVar1 = false;
  local_410 = 0;
  local_414 = 0x1ff;
  local_41c = 0x200;
  local_40c = 0;
  local_418 = 0x200;
  local_3e0 = 0.0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"d","");
  local_3e8 = 0;
LAB_00103874:
  do {
    while (iVar4 = ya_getopt_long(argc,argv,"s:e:l:m:S:L:M:f:h",(option *)0x0,(int *)0x0),
          iVar4 < 0x53) {
      if (iVar4 == 0x4c) {
        std::__cxx11::string::string((string *)&local_3d8,ya_optarg,(allocator *)local_1d0);
        bVar13 = sptk::ConvertStringToInteger(&local_3d8,&local_418);
        bVar2 = local_418 < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p);
        }
        bVar1 = true;
        if (!bVar13 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3d8,
                     "The argument for the -L option must be a positive integer",0x39);
          local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
          sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
          goto LAB_0010435c;
        }
      }
      else {
        if (iVar4 != 0x4d) {
          if (iVar4 != -1) {
switchD_001038a9_caseD_67:
            iVar4 = 1;
            anon_unknown.dwarf_ce22::PrintUsage((ostream *)&std::cerr);
            goto LAB_00104391;
          }
          if ((local_3e8 & 1) == 0) {
            local_414 = local_41c + -1;
          }
          else {
            if (local_41c <= local_414) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_3d8,"End number ",0xb);
              poVar8 = (ostream *)std::ostream::operator<<(&local_3d8,local_414);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," must be less than block length ",0x20);
              std::ostream::operator<<(poVar8,local_41c);
              local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
              sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
              goto LAB_0010435c;
            }
            if (local_414 < local_410) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_3d8,"End number ",0xb);
              poVar8 = (ostream *)std::ostream::operator<<(&local_3d8,local_414);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," must be equal to or greater than start number ",0x2f);
              std::ostream::operator<<(poVar8,local_410);
              local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
              sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
              goto LAB_0010435c;
            }
          }
          if (local_41c <= local_410) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_3d8,"Start number ",0xd);
            poVar8 = (ostream *)std::ostream::operator<<(&local_3d8,local_410);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," must be less than block length ",0x20);
            std::ostream::operator<<(poVar8,local_41c);
            local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
            sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
            goto LAB_0010435c;
          }
          iVar4 = (local_414 - local_410) + 1;
          if (bVar1) {
            if (local_418 < iVar4 + local_40c) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_3d8,"Output block length is too short",0x20);
              local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
              sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
              goto LAB_0010435c;
            }
          }
          else {
            local_418 = iVar4 + local_40c;
          }
          uVar5 = argc - ya_optind;
          if (uVar5 == 0 || argc < ya_optind) {
            __s = (char *)0x0;
            goto LAB_00104241;
          }
          lVar11 = (ulong)uVar5 + 1;
          ppcVar10 = argv + ((long)argc - (ulong)uVar5);
          pcVar12 = (char *)0x0;
          goto LAB_0010419e;
        }
        std::__cxx11::string::string((string *)&local_3d8,ya_optarg,(allocator *)local_1d0);
        bVar1 = sptk::ConvertStringToInteger(&local_3d8,&local_418);
        bVar2 = local_418 < 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p);
        }
        if (!bVar1 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3d8,"The argument for the -M option must be a ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3d8,"non-negative integer",0x14);
          local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
          sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
          goto LAB_0010435c;
        }
        local_418 = local_418 + 1;
        bVar1 = true;
      }
    }
    switch(iVar4) {
    case 0x65:
      std::__cxx11::string::string((string *)&local_3d8,ya_optarg,(allocator *)local_1d0);
      bVar2 = sptk::ConvertStringToInteger(&local_3d8,&local_414);
      bVar13 = local_414 < 0;
      paVar7 = &local_3d8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar7) {
        operator_delete(local_3d8._M_dataplus._M_p);
        paVar7 = extraout_RAX;
      }
      local_3e8 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
      if (!bVar2 || bVar13) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3d8,"The argument for the -e option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3d8,"non-negative integer",0x14);
        local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
        sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
        goto LAB_0010435c;
      }
      goto LAB_00103874;
    case 0x66:
      std::__cxx11::string::string((string *)&local_3d8,ya_optarg,(allocator *)local_1d0);
      bVar2 = sptk::ConvertStringToDouble(&local_3d8,&local_3e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p);
      }
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3d8,"The argument for the -f option must be numeric",0x2e);
        local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
        sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
        goto LAB_0010435c;
      }
      goto LAB_00103874;
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
      goto switchD_001038a9_caseD_67;
    case 0x68:
      iVar4 = 0;
      anon_unknown.dwarf_ce22::PrintUsage((ostream *)&std::cout);
      goto LAB_00104391;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_3d8,ya_optarg,(allocator *)local_1d0);
      bVar13 = sptk::ConvertStringToInteger(&local_3d8,&local_41c);
      bVar2 = local_41c < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p);
      }
      if (!bVar13 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3d8,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
        sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
        goto LAB_0010435c;
      }
      goto LAB_00103874;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_3d8,ya_optarg,(allocator *)local_1d0);
      bVar2 = sptk::ConvertStringToInteger(&local_3d8,&local_41c);
      bVar13 = local_41c < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p);
      }
      if (!bVar2 || bVar13) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3d8,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3d8,"non-negative integer",0x14);
        local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
        sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
        goto LAB_0010435c;
      }
      local_41c = local_41c + 1;
      goto LAB_00103874;
    case 0x73:
      std::__cxx11::string::string((string *)&local_3d8,ya_optarg,(allocator *)local_1d0);
      bVar2 = sptk::ConvertStringToInteger(&local_3d8,&local_410);
      bVar13 = local_410 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p);
      }
      if (!bVar2 || bVar13) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3d8,"The argument for the -s option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3d8,"non-negative integer",0x14);
        local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
        sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
        goto LAB_0010435c;
      }
      goto LAB_00103874;
    }
    if (iVar4 != 0x53) goto switchD_001038a9_caseD_67;
    std::__cxx11::string::string((string *)&local_3d8,ya_optarg,(allocator *)local_1d0);
    bVar2 = sptk::ConvertStringToInteger(&local_3d8,&local_40c);
    bVar13 = -1 < local_40c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
  } while (bVar2 && bVar13);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_3d8,"The argument for the -S option must be a ",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_3d8,"non-negative integer",0x14);
  local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
  sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
  goto LAB_0010435c;
LAB_0010419e:
  do {
    __s = *ppcVar10;
    if (*__s == '+') {
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      sVar9 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,__s,__s + sVar9);
      std::__cxx11::string::substr((ulong)local_1d0,(ulong)&local_3d8);
      std::__cxx11::string::operator=((string *)&local_50,(string *)local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
        operator_delete(local_1d0[0]._M_dataplus._M_p);
      }
      __s = pcVar12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p);
      }
    }
    else if (pcVar12 != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3d8,"Too many input files",0x14);
      local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
      sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0[0]._M_dataplus._M_p == &local_1d0[0].field_2) goto LAB_0010436e;
      goto LAB_00104369;
    }
    lVar11 = lVar11 + -1;
    ppcVar10 = ppcVar10 + 1;
    pcVar12 = __s;
  } while (1 < lVar11);
LAB_00104241:
  bVar1 = sptk::SetBinaryMode();
  if (bVar1) {
    this = &local_3d8;
    std::ifstream::ifstream(this);
    if ((__s == (char *)0x0) ||
       (std::ifstream::open((char *)&local_3d8,(_Ios_Openmode)__s),
       (abStack_3b8[*(long *)(local_3d8._M_dataplus._M_p + -0x18)] & 5) == 0)) {
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        this = (string *)&std::cin;
      }
      anon_unknown.dwarf_ce22::BlockCopyWrapper::BlockCopyWrapper
                (&local_58,&local_50,local_410,local_414,local_41c,local_40c,local_418,local_3e0);
      if (local_58.block_copy_ == (BlockCopyInterface *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"Unexpected argument for the +type option",0x28);
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"bcp","");
        sptk::PrintErrorMessage(&local_408,(ostringstream *)local_1d0);
        goto LAB_0010459d;
      }
      iVar6 = (*(local_58.block_copy_)->_vptr_BlockCopyInterface[2])(local_58.block_copy_,this);
      iVar4 = 0;
      if ((char)iVar6 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"Failed to copy",0xe);
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"bcp","");
        sptk::PrintErrorMessage(&local_408,(ostringstream *)local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        iVar4 = 1;
      }
      (*(local_58.block_copy_)->_vptr_BlockCopyInterface[1])(local_58.block_copy_);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d0,"Cannot open file ",0x11);
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,__s,sVar9);
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"bcp","");
      sptk::PrintErrorMessage(&local_408,(ostringstream *)local_1d0);
LAB_0010459d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      std::ios_base::~ios_base(local_160);
      iVar4 = 1;
    }
    std::ifstream::~ifstream(&local_3d8);
    goto LAB_00104391;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_3d8,"Cannot set translation mode",0x1b);
  local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bcp","");
  sptk::PrintErrorMessage(local_1d0,(ostringstream *)&local_3d8);
LAB_0010435c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
LAB_00104369:
    operator_delete(local_1d0[0]._M_dataplus._M_p);
  }
LAB_0010436e:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3d8);
  std::ios_base::~ios_base(local_368);
  iVar4 = 1;
LAB_00104391:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int input_start_number(kDefaultInputStartNumber);
  int input_end_number(kDefaultInputBlockLength - 1);
  int input_block_length(kDefaultInputBlockLength);
  int output_start_number(kDefaultOutputStartNumber);
  int output_block_length(kDefaultInputBlockLength);
  double pad_value(kDefaultPadValue);
  std::string data_type(kDefaultDataType);
  bool is_input_end_number_specified(false);
  bool is_output_block_length_specified(false);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "s:e:l:m:S:L:M:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &input_start_number) ||
            input_start_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToInteger(optarg, &input_end_number) ||
            input_end_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        is_input_end_number_specified = true;
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &input_block_length) ||
            input_block_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &input_block_length) ||
            input_block_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        ++input_block_length;
        break;
      }
      case 'S': {
        if (!sptk::ConvertStringToInteger(optarg, &output_start_number) ||
            output_start_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToInteger(optarg, &output_block_length) ||
            output_block_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be a positive integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        is_output_block_length_specified = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &output_block_length) ||
            output_block_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        ++output_block_length;
        is_output_block_length_specified = true;
        break;
      }
      case 'f': {
        if (!sptk::ConvertStringToDouble(optarg, &pad_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -f option must be numeric";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!is_input_end_number_specified) {
    input_end_number = input_block_length - 1;
  } else if (input_block_length <= input_end_number) {
    std::ostringstream error_message;
    error_message << "End number " << input_end_number
                  << " must be less than block length " << input_block_length;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  } else if (input_end_number < input_start_number) {
    std::ostringstream error_message;
    error_message << "End number " << input_end_number
                  << " must be equal to or greater than start number "
                  << input_start_number;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  if (input_block_length <= input_start_number) {
    std::ostringstream error_message;
    error_message << "Start number " << input_start_number
                  << " must be less than block length " << input_block_length;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  const int copy_length(input_end_number - input_start_number + 1);
  if (!is_output_block_length_specified) {
    output_block_length = output_start_number + copy_length;
  } else if (output_block_length < output_start_number + copy_length) {
    std::ostringstream error_message;
    error_message << "Output block length is too short";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("bcp", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("bcp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  BlockCopyWrapper block_copy(data_type, input_start_number, input_end_number,
                              input_block_length, output_start_number,
                              output_block_length, pad_value);

  if (!block_copy.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  if (!block_copy.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to copy";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  return 0;
}